

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this)

{
  bool bVar1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_RDI;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_00000058;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_000000f8;
  undefined3 uVar2;
  token_type in_stack_ffffffffffffffe4;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  token_type tVar3;
  
  this_00 = in_RDI;
  if (((in_RDI->position).chars_read_total != 0) || (bVar1 = skip_bom(in_RDI), bVar1)) {
    do {
      get(this_00);
      uVar2 = (undefined3)in_stack_ffffffffffffffe4;
      in_stack_ffffffffffffffe4 = CONCAT13(1,uVar2);
      if (((in_RDI->current != 0x20) &&
          (in_stack_ffffffffffffffe4 = CONCAT13(1,uVar2), in_RDI->current != 9)) &&
         (in_stack_ffffffffffffffe4 = CONCAT13(1,uVar2), in_RDI->current != 10)) {
        in_stack_ffffffffffffffe4 = CONCAT13(in_RDI->current == 0xd,uVar2);
      }
    } while ((char)(in_stack_ffffffffffffffe4 >> 0x18) != '\0');
    switch(in_RDI->current) {
    default:
      in_RDI->error_message = "invalid literal";
      tVar3 = parse_error;
      break;
    case 0x22:
      tVar3 = scan_string(in_stack_000000f8);
      break;
    case 0x2c:
      tVar3 = value_separator;
      break;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      tVar3 = scan_number(in_stack_00000058);
      break;
    case 0x3a:
      tVar3 = name_separator;
      break;
    case 0x5b:
      tVar3 = begin_array;
      break;
    case 0x5d:
      tVar3 = end_array;
      break;
    case 0x66:
      tVar3 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
      break;
    case 0x6e:
      tVar3 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
      break;
    case 0x74:
      tVar3 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
      break;
    case 0x7b:
      tVar3 = begin_object;
      break;
    case 0x7d:
      tVar3 = end_object;
      break;
    case -1:
    case 0:
      tVar3 = end_of_input;
    }
  }
  else {
    in_RDI->error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
    tVar3 = parse_error;
  }
  return tVar3;
}

Assistant:

token_type scan()
    {
        // initially, skip the BOM
        if (position.chars_read_total == 0 and not skip_bom())
        {
            error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
            return token_type::parse_error;
        }

        // read next character and ignore whitespace
        do
        {
            get();
        }
        while (current == ' ' or current == '\t' or current == '\n' or current == '\r');

        switch (current)
        {
            // structural characters
            case '[':
                return token_type::begin_array;
            case ']':
                return token_type::end_array;
            case '{':
                return token_type::begin_object;
            case '}':
                return token_type::end_object;
            case ':':
                return token_type::name_separator;
            case ',':
                return token_type::value_separator;

            // literals
            case 't':
                return scan_literal("true", 4, token_type::literal_true);
            case 'f':
                return scan_literal("false", 5, token_type::literal_false);
            case 'n':
                return scan_literal("null", 4, token_type::literal_null);

            // string
            case '\"':
                return scan_string();

            // number
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return scan_number();

            // end of input (the null byte is needed when parsing from
            // string literals)
            case '\0':
            case std::char_traits<char>::eof():
                return token_type::end_of_input;

            // error
            default:
                error_message = "invalid literal";
                return token_type::parse_error;
        }
    }